

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularPrimitive::GenerateSwappingCode
          (SingularPrimitive *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularPrimitive *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_oneof(&this->super_FieldGeneratorBase);
  pPVar1 = local_18;
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "\n      //~ A `using std::swap;` is already present in this function.\n      swap($field_$, other->$field_$);\n    "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  return;
}

Assistant:

void GenerateSwappingCode(io::Printer* p) const override {
    if (is_oneof()) {
      // Don't print any swapping code. Swapping the union will swap this field.
      return;
    }

    p->Emit(R"cc(
      //~ A `using std::swap;` is already present in this function.
      swap($field_$, other->$field_$);
    )cc");
  }